

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.h
# Opt level: O1

void __thiscall piece_data::set(piece_data *this,Color *c,Piece *p,Square *s,info *ifo)

{
  unsigned_long *puVar1;
  Square SVar2;
  Color CVar3;
  Piece PVar4;
  int iVar5;
  U64 UVar6;
  int iVar7;
  
  SVar2 = *s;
  CVar3 = *c;
  PVar4 = *p;
  puVar1 = (this->bitmap)._M_elems[CVar3]._M_elems + PVar4;
  *puVar1 = *puVar1 | (&bitboards::squares)[SVar2];
  puVar1 = (this->bycolor)._M_elems + CVar3;
  *puVar1 = *puVar1 | (&bitboards::squares)[SVar2];
  (this->color_on)._M_elems[SVar2] = CVar3;
  CVar3 = *c;
  iVar5 = (this->number_of)._M_elems[CVar3]._M_elems[PVar4];
  iVar7 = iVar5 + 1;
  (this->number_of)._M_elems[CVar3]._M_elems[PVar4] = iVar7;
  (this->piece_idx)._M_elems[CVar3]._M_elems[PVar4]._M_elems[SVar2] = iVar7;
  (this->square_of)._M_elems[CVar3]._M_elems[PVar4]._M_elems[(long)iVar5 + 1] = SVar2;
  SVar2 = *s;
  (this->piece_on)._M_elems[SVar2] = PVar4;
  if (*p == king) {
    (this->king_sq)._M_elems[CVar3] = SVar2;
  }
  UVar6 = zobrist::piece(s,c,p);
  ifo->key = ifo->key ^ UVar6;
  UVar6 = zobrist::piece(s,c,p);
  ifo->mkey = ifo->mkey ^ UVar6;
  UVar6 = zobrist::piece(s,c,p);
  ifo->repkey = ifo->repkey ^ UVar6;
  if (*p == pawn) {
    UVar6 = zobrist::piece(s,c,p);
    ifo->pawnkey = ifo->pawnkey ^ UVar6;
  }
  return;
}

Assistant:

inline void piece_data::set(const Color& c, const Piece& p, const Square& s, info& ifo) {
	bitmap[c][p] |= bitboards::squares[s];
	bycolor[c] |= bitboards::squares[s];
	color_on[s] = c;
	number_of[c][p] += 1;
	piece_idx[c][p][s] = number_of[c][p];
	square_of[c][p][number_of[c][p]] = s;
	piece_on[s] = p;
	if (p == Piece::king) king_sq[c] = s;

	ifo.key ^= zobrist::piece(s, c, p);
	ifo.mkey ^= zobrist::piece(s, c, p);
	ifo.repkey ^= zobrist::piece(s, c, p);
	if (p == Piece::pawn) ifo.pawnkey ^= zobrist::piece(s, c, p);
}